

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O0

_Bool nbt_map(nbt_node *tree,nbt_visitor_t v,void *aux)

{
  _Bool _Var1;
  list_head *local_38;
  list_head *pos_1;
  list_head *pos;
  void *aux_local;
  nbt_visitor_t v_local;
  nbt_node *tree_local;
  
  if (v == (nbt_visitor_t)0x0) {
    __assert_fail("v",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0xc9,"_Bool nbt_map(nbt_node *, nbt_visitor_t, void *)");
  }
  if (tree == (nbt_node *)0x0) {
    tree_local._7_1_ = true;
  }
  else {
    _Var1 = (*v)(tree,aux);
    if (_Var1) {
      if (tree->type == TAG_COMPOUND) {
        for (pos_1 = (((tree->payload).tag_list)->entry).flink;
            pos_1 != &((tree->payload).tag_list)->entry; pos_1 = pos_1->flink) {
          _Var1 = nbt_map((nbt_node *)pos_1[-1].flink,v,aux);
          if (!_Var1) {
            return false;
          }
        }
      }
      if (tree->type == TAG_LIST) {
        for (local_38 = (((tree->payload).tag_list)->entry).flink;
            local_38 != &((tree->payload).tag_list)->entry; local_38 = local_38->flink) {
          _Var1 = nbt_map((nbt_node *)local_38[-1].flink,v,aux);
          if (!_Var1) {
            return false;
          }
        }
      }
      tree_local._7_1_ = true;
    }
    else {
      tree_local._7_1_ = false;
    }
  }
  return tree_local._7_1_;
}

Assistant:

bool nbt_map(nbt_node* tree, nbt_visitor_t v, void* aux)
{
    assert(v);

    if(tree == NULL)  return true;
    if(!v(tree, aux)) return false;

    /* And if the item is a list or compound, recurse through each of their elements. */
    if(tree->type == TAG_COMPOUND)
    {
        struct list_head* pos;

        list_for_each(pos, &tree->payload.tag_compound->entry)
            if(!nbt_map(list_entry(pos, struct nbt_list, entry)->data, v, aux))
                return false;
    }
    
    if(tree->type == TAG_LIST)
    {
        struct list_head* pos;

        list_for_each(pos, &tree->payload.tag_list->entry)
            if(!nbt_map(list_entry(pos, struct nbt_list, entry)->data, v, aux))
                return false;
    }

    return true;
}